

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::CZString::CZString(CZString *this,CZString *other)

{
  long *in_RSI;
  long *in_RDI;
  uint local_24;
  char *local_20;
  
  if (((*(uint *)(in_RSI + 1) & 3) == 0) || (*in_RSI == 0)) {
    local_20 = (char *)*in_RSI;
  }
  else {
    local_20 = duplicateStringValue((char *)this,(size_t)other);
  }
  *in_RDI = (long)local_20;
  if (*in_RSI == 0) {
    local_24 = *(uint *)(in_RSI + 1) & 3;
  }
  else {
    local_24 = (uint)((*(uint *)(in_RSI + 1) & 3) != 0);
  }
  *(uint *)(in_RDI + 1) = *(uint *)(in_RDI + 1) & 0xfffffffc | local_24;
  *(uint *)(in_RDI + 1) = *(uint *)(in_RDI + 1) & 3 | *(uint *)(in_RSI + 1) & 0xfffffffc;
  return;
}

Assistant:

Value::CZString::CZString(const CZString& other)
    : cstr_(other.storage_.policy_ != noDuplication && other.cstr_ != 0
                ? duplicateStringValue(other.cstr_, other.storage_.length_)
                : other.cstr_)
{
  storage_.policy_ = (other.cstr_
                 ? (other.storage_.policy_ == noDuplication
                     ? noDuplication : duplicate)
                 : other.storage_.policy_);
  storage_.length_ = other.storage_.length_;
}